

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O2

bool __thiscall
ProcessProgress::start_child_process
          (ProcessProgress *this,vector<ProcessProgress,_std::allocator<ProcessProgress>_> *siblings
          )

{
  pointer pPVar1;
  int iVar2;
  __pid_t _Var3;
  long *plVar4;
  ProcessProgress *sibling;
  pointer pPVar5;
  bool bVar6;
  int input_fds [2];
  int crash_fds [2];
  string local_1a8;
  undefined1 local_188 [8];
  epoll_data_t local_180;
  size_type local_178;
  string local_160 [8];
  size_type local_158;
  string local_100 [8];
  size_type local_f8;
  string local_e0 [8];
  size_type local_d8;
  uint local_70;
  uint local_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint local_5c;
  SharedControlBlock *local_58;
  
  this->compute_progress = -1;
  this->graphics_progress = -1;
  this->raytracing_progress = -1;
  this->stopped = false;
  if (((this->end_graphics_index <= this->start_graphics_index) &&
      (this->end_compute_index <= this->start_compute_index)) &&
     (this->end_raytracing_index <= this->start_raytracing_index)) {
    return true;
  }
  iVar2 = pipe(crash_fds);
  if ((-1 < iVar2) && (iVar2 = pipe(input_fds), -1 < iVar2)) {
    _Var3 = fork();
    if (0 < _Var3) {
      this->crash_fd = crash_fds[0];
      this->pid = _Var3;
      this->heartbeats = 1;
      plVar4 = (long *)(Global::faulty_spirv_modules + 0x10);
      while (plVar4 = (long *)*plVar4, plVar4 != (long *)0x0) {
        sprintf(local_188,"%lx\n",plVar4[1]);
        write_all(input_fds[1],local_188);
      }
      close(input_fds[1]);
      close(crash_fds[1]);
      close(input_fds[0]);
      Global::active_processes = Global::active_processes + 1;
      local_180.fd = 0;
      local_188._4_4_ = this->index;
      local_188._0_4_ = 0x2001;
      iVar2 = epoll_ctl(Global::epoll_fd,1,this->crash_fd,(epoll_event *)local_188);
      bVar6 = -1 < iVar2;
      if (bVar6) {
        return bVar6;
      }
      fwrite("Fossilize ERROR: Failed to add file to epoll.\n",0x2e,1,_stderr);
      fflush(_stderr);
      return bVar6;
    }
    if (_Var3 == 0) {
      close(Global::signal_fd);
      close(Global::epoll_fd);
      close(Global::timer_fd);
      close(crash_fds[0]);
      close(input_fds[1]);
      if (-1 < Global::control_fd) {
        close(Global::control_fd);
      }
      iVar2 = pthread_sigmask(2,(__sigset_t *)Global::old_mask,(__sigset_t *)0x0);
      if (iVar2 != 0) {
        return true;
      }
      pPVar1 = (siblings->super__Vector_base<ProcessProgress,_std::allocator<ProcessProgress>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pPVar5 = (siblings->super__Vector_base<ProcessProgress,_std::allocator<ProcessProgress>_>
                    )._M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1;
          pPVar5 = pPVar5 + 1) {
        if (pPVar5 != this) {
          if (-1 < pPVar5->crash_fd) {
            close(pPVar5->crash_fd);
            pPVar5->crash_fd = -1;
          }
          if (-1 < pPVar5->timer_fd) {
            close(pPVar5->timer_fd);
            pPVar5->timer_fd = -1;
          }
          if (-1 < pPVar5->watchdog_timer_fd) {
            close(pPVar5->watchdog_timer_fd);
            pPVar5->watchdog_timer_fd = -1;
          }
        }
      }
      iVar2 = dup2(crash_fds[1],1);
      if (iVar2 < 0) {
        return true;
      }
      iVar2 = dup2(input_fds[0],0);
      if (iVar2 < 0) {
        return true;
      }
      close(crash_fds[1]);
      close(input_fds[0]);
      if ((Global::quiet_slave == '\x01') && (iVar2 = open("/dev/null",1), -1 < iVar2)) {
        dup2(iVar2,2);
        close(iVar2);
      }
      ThreadedReplayer::Options::Options
                ((Options *)local_188,(Options *)Global::base_replayer_options);
      local_70 = this->start_graphics_index;
      uStack_68 = this->start_compute_index;
      uStack_60 = this->start_raytracing_index;
      local_6c = this->end_graphics_index;
      uStack_64 = this->end_compute_index;
      local_5c = this->end_raytracing_index;
      local_58 = Global::control_block;
      if ((local_178 != 0) && (this->index != 0)) {
        std::__cxx11::string::append((char *)(local_188 + 8));
        std::__cxx11::to_string(&local_1a8,this->index);
        std::__cxx11::string::append((string *)(local_188 + 8));
        std::__cxx11::string::_M_dispose();
      }
      if ((local_158 != 0) && (this->index != 0)) {
        std::__cxx11::string::append((char *)(local_188 + 0x28));
        std::__cxx11::to_string(&local_1a8,this->index);
        std::__cxx11::string::append((string *)(local_188 + 0x28));
        std::__cxx11::string::_M_dispose();
      }
      if ((local_d8 != 0) && (this->index != 0)) {
        std::__cxx11::string::append((char *)local_e0);
        std::__cxx11::to_string(&local_1a8,this->index);
        std::__cxx11::string::append(local_e0);
        std::__cxx11::string::_M_dispose();
      }
      if ((local_f8 != 0) && (this->index != 0)) {
        std::__cxx11::string::append((char *)local_100);
        std::__cxx11::to_string(&local_1a8,this->index);
        std::__cxx11::string::append(local_100);
        std::__cxx11::string::_M_dispose();
      }
      iVar2 = run_slave_process((Options *)Global::device_options,(Options *)local_188,
                                (vector<const_char_*,_std::allocator<const_char_*>_> *)
                                Global::databases);
      exit(iVar2);
    }
  }
  return false;
}

Assistant:

bool ProcessProgress::start_child_process(vector<ProcessProgress> &siblings)
{
	graphics_progress = -1;
	compute_progress = -1;
	raytracing_progress = -1;
	stopped = false;

	if (start_graphics_index >= end_graphics_index &&
	    start_compute_index >= end_compute_index &&
	    start_raytracing_index >= end_raytracing_index)
	{
		// Nothing to do.
		return true;
	}

	int crash_fds[2];
	int input_fds[2];
	if (pipe(crash_fds) < 0)
		return false;
	if (pipe(input_fds) < 0)
		return false;

	pid_t new_pid = fork(); // Fork off a child.
	if (new_pid > 0)
	{
		// We're the parent, keep track of the process in a thread to avoid a lot of complex multiplexing code.
		crash_fd = crash_fds[0];
		pid = new_pid;
		heartbeats = 1;

		send_faulty_modules_and_close(input_fds[1]);
		close(crash_fds[1]);
		close(input_fds[0]);
		Global::active_processes++;

		epoll_event event = {};
		event.data.u32 = index;
		event.events = EPOLLIN | EPOLLRDHUP;
		if (epoll_ctl(Global::epoll_fd, EPOLL_CTL_ADD, crash_fd, &event) < 0)
		{
			LOGE("Failed to add file to epoll.\n");
			return false;
		}

		return true;
	}
	else if (new_pid == 0)
	{
		// Close various FDs we won't use.
		close(Global::signal_fd);
		close(Global::epoll_fd);
		close(Global::timer_fd);
		close(crash_fds[0]);
		close(input_fds[1]);
		if (Global::control_fd >= 0)
			close(Global::control_fd);

		// We're the child process.
		// Unblock the signal mask.
		if (pthread_sigmask(SIG_SETMASK, &Global::old_mask, nullptr) != 0)
			return EXIT_FAILURE;

		// Make sure we don't hold unrelated epoll sensitive FDs open.
		for (auto &sibling : siblings)
		{
			if (&sibling == this)
				continue;

			if (sibling.crash_fd >= 0)
			{
				::close(sibling.crash_fd);
				sibling.crash_fd = -1;
			}

			if (sibling.timer_fd >= 0)
			{
				close(sibling.timer_fd);
				sibling.timer_fd = -1;
			}

			if (sibling.watchdog_timer_fd >= 0)
			{
				close(sibling.watchdog_timer_fd);
				sibling.watchdog_timer_fd = -1;
			}
		}

		// Override stdin/stdout.
		if (dup2(crash_fds[1], STDOUT_FILENO) < 0)
			return EXIT_FAILURE;
		if (dup2(input_fds[0], STDIN_FILENO) < 0)
			return EXIT_FAILURE;

		close(crash_fds[1]);
		close(input_fds[0]);

		// Redirect stderr to /dev/null if the child process is supposed to be quiet.
		if (Global::quiet_slave)
		{
			int fd_dev_null = open("/dev/null", O_WRONLY);
			if (fd_dev_null >= 0)
			{
				dup2(fd_dev_null, STDERR_FILENO);
				close(fd_dev_null);
			}
		}

		// Run the slave process.
		auto copy_opts = Global::base_replayer_options;
		copy_opts.start_graphics_index = start_graphics_index;
		copy_opts.end_graphics_index = end_graphics_index;
		copy_opts.start_compute_index = start_compute_index;
		copy_opts.end_compute_index = end_compute_index;
		copy_opts.start_raytracing_index = start_raytracing_index;
		copy_opts.end_raytracing_index = end_raytracing_index;
		copy_opts.control_block = Global::control_block;
		if (!copy_opts.on_disk_pipeline_cache_path.empty() && index != 0)
		{
			copy_opts.on_disk_pipeline_cache_path += ".";
			copy_opts.on_disk_pipeline_cache_path += std::to_string(index);
		}

		if (!copy_opts.on_disk_validation_cache_path.empty() && index != 0)
		{
			copy_opts.on_disk_validation_cache_path += ".";
			copy_opts.on_disk_validation_cache_path += std::to_string(index);
		}

		if (!copy_opts.pipeline_stats_path.empty() && index != 0)
		{
			copy_opts.pipeline_stats_path += ".";
			copy_opts.pipeline_stats_path += std::to_string(index);
		}

		if (!copy_opts.on_disk_module_identifier_path.empty() && index != 0)
		{
			copy_opts.on_disk_module_identifier_path += ".";
			copy_opts.on_disk_module_identifier_path += std::to_string(index);
		}

		exit(run_slave_process(Global::device_options, copy_opts, Global::databases));
	}
	else
		return false;
}